

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Nan_Test::Body(iu_SyntaxTest_x_iutest_x_Nan_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fnan;
  double dnan;
  AssertionResult iutest_ar;
  allocator<char> local_1fd;
  float local_1fc;
  pointer local_1f8;
  AssertionResult local_1f0;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  local_1fc = NAN;
  local_1f8 = (pointer)0x7ff8000000000000;
  iuutil::CmpHelperIsNan<float>(&local_1f0,"fnan",&local_1fc);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = local_1fc;
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(float *)&local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1fd);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x1eb;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p == &local_1f0.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_1f0.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0.m_message._M_dataplus._M_p,
                      local_1f0.m_message.field_2._M_allocated_capacity + 1);
    }
    if ((local_1fc != 0.0) || (NAN(local_1fc))) {
      iuutil::CmpHelperIsNan<float>(&local_1f0,"fnan",&local_1fc);
      if (local_1f0.m_result == false) {
        memset((iu_global_format_stringstream *)local_198,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_198);
        local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = local_1fc;
        iutest::detail::iuStreamMessage::operator<<
                  ((iuStreamMessage *)local_198,(float *)&local_1c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1fd);
        local_1c8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
        ;
        local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x1ed;
        local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
        std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0.m_message._M_dataplus._M_p,
                        local_1f0.m_message.field_2._M_allocated_capacity + 1);
      }
    }
    if (((double)local_1f8 != 0.0) || (NAN((double)local_1f8))) {
      iuutil::CmpHelperIsNan<double>(&local_1f0,"dnan",(double *)&local_1f8);
      if (local_1f0.m_result == false) {
        memset((iu_global_format_stringstream *)local_198,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_198);
        local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1f8;
        iutest::detail::iuStreamMessage::operator<<
                  ((iuStreamMessage *)local_198,(double *)&local_1c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1fd);
        local_1c8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
        ;
        local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x1ef;
        local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
        iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
        std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0.m_message._M_dataplus._M_p,
                        local_1f0.m_message.field_2._M_allocated_capacity + 1);
      }
    }
    if (((double)local_1f8 == 0.0) && (!NAN((double)local_1f8))) {
      return;
    }
    iuutil::CmpHelperIsNan<double>(&local_1f0,"dnan",(double *)&local_1f8);
    if (local_1f0.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1f8;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(double *)&local_1c8)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1fd);
      local_1c8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x1f1;
      local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_1f0.m_message._M_dataplus._M_p,
                  local_1f0.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST(SyntaxTest, Nan)
{
    float  fnan = ::std::numeric_limits<float>::quiet_NaN();
    double dnan = ::std::numeric_limits<double>::quiet_NaN();
    if( fnan )
        IUTEST_ASSERT_NAN(fnan) << fnan;
    if( fnan )
        IUTEST_EXPECT_NAN(fnan) << fnan;
    if( dnan )
        IUTEST_INFORM_NAN(dnan) << dnan;
    if( dnan )
        IUTEST_ASSUME_NAN(dnan) << dnan;
}